

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::ParseURL
               (string *URL,string *protocol,string *username,string *password,string *hostname,
               string *dataport,string *database,bool decode)

{
  bool bVar1;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  undefined4 local_128;
  undefined1 local_118 [8];
  RegularExpression urlRe;
  bool decode_local;
  string *dataport_local;
  string *hostname_local;
  string *password_local;
  string *username_local;
  string *protocol_local;
  string *URL_local;
  
  urlRe._207_1_ = decode;
  RegularExpression::RegularExpression
            ((RegularExpression *)local_118,
             "([a-zA-Z0-9]*)://(([A-Za-z0-9]+)(:([^:@]+))?@)?([^:@/]*)(:([0-9]+))?/(.+)?");
  bVar1 = RegularExpression::find((RegularExpression *)local_118,URL);
  if (bVar1) {
    RegularExpression::match_abi_cxx11_(&local_148,(RegularExpression *)local_118,1);
    std::__cxx11::string::operator=((string *)protocol,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    RegularExpression::match_abi_cxx11_(&local_168,(RegularExpression *)local_118,3);
    std::__cxx11::string::operator=((string *)username,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    RegularExpression::match_abi_cxx11_(&local_188,(RegularExpression *)local_118,5);
    std::__cxx11::string::operator=((string *)password,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    RegularExpression::match_abi_cxx11_(&local_1a8,(RegularExpression *)local_118,6);
    std::__cxx11::string::operator=((string *)hostname,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    RegularExpression::match_abi_cxx11_(&local_1c8,(RegularExpression *)local_118,8);
    std::__cxx11::string::operator=((string *)dataport,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    RegularExpression::match_abi_cxx11_(&local_1e8,(RegularExpression *)local_118,9);
    std::__cxx11::string::operator=((string *)database,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    if ((urlRe._207_1_ & 1) != 0) {
      DecodeURL(&local_208,username);
      std::__cxx11::string::operator=((string *)username,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      DecodeURL(&local_228,password);
      std::__cxx11::string::operator=((string *)password,(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      DecodeURL(&local_248,hostname);
      std::__cxx11::string::operator=((string *)hostname,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      DecodeURL(&local_268,dataport);
      std::__cxx11::string::operator=((string *)dataport,(string *)&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      DecodeURL(&local_288,database);
      std::__cxx11::string::operator=((string *)database,(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
    }
    URL_local._7_1_ = true;
  }
  else {
    URL_local._7_1_ = false;
  }
  local_128 = 1;
  RegularExpression::~RegularExpression((RegularExpression *)local_118);
  return URL_local._7_1_;
}

Assistant:

bool SystemTools::ParseURL(const std::string& URL, std::string& protocol,
                           std::string& username, std::string& password,
                           std::string& hostname, std::string& dataport,
                           std::string& database, bool decode)
{
  kwsys::RegularExpression urlRe(VTK_URL_REGEX);
  if (!urlRe.find(URL))
    return false;

  // match 0 URL
  // match 1 protocol
  // match 2 mangled user
  // match 3 username
  // match 4 mangled password
  // match 5 password
  // match 6 hostname
  // match 7 mangled port
  // match 8 dataport
  // match 9 database name

  protocol = urlRe.match(1);
  username = urlRe.match(3);
  password = urlRe.match(5);
  hostname = urlRe.match(6);
  dataport = urlRe.match(8);
  database = urlRe.match(9);

  if (decode) {
    username = DecodeURL(username);
    password = DecodeURL(password);
    hostname = DecodeURL(hostname);
    dataport = DecodeURL(dataport);
    database = DecodeURL(database);
  }

  return true;
}